

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Jsrt.cpp
# Opt level: O2

JsErrorCode
JsCreateExternalObjectWithPrototype
          (void *data,JsFinalizeCallback finalizeCallback,JsValueRef prototype,JsValueRef *object)

{
  ScriptContext *scriptContext;
  ScriptContext *pSVar1;
  BOOL BVar2;
  JsrtContext *pJVar3;
  RecyclableObject *pRVar4;
  JsrtExternalObject *pJVar5;
  JsErrorCode exitStatus;
  AutoNestedHandledExceptionType local_68 [2];
  AutoNestedHandledExceptionType __autoNestedHandledExceptionType;
  undefined1 auStack_48 [8];
  TTDRecorder _actionEntryPopper;
  
  auStack_48 = (undefined1  [8])0x0;
  _actionEntryPopper.m_actionEvent = (EventLogEntry *)0x0;
  pJVar3 = JsrtContext::GetCurrent();
  if (pJVar3 == (JsrtContext *)0x0) {
    exitStatus = JsErrorNoCurrentContext;
    goto LAB_00362931;
  }
  scriptContext = (((pJVar3->javascriptLibrary).ptr)->super_JavascriptLibraryBase).scriptContext.ptr
  ;
  AutoNestedHandledExceptionType::AutoNestedHandledExceptionType
            (local_68,ExceptionType_StackOverflow|ExceptionType_OutOfMemory);
  if (scriptContext->TTDShouldPerformRecordAction == true) {
    TTD::EventLog::RecordJsRTAllocateExternalObject
              (scriptContext->threadContext->TTDLog,(TTDJsRTActionResultAutoRecorder *)auStack_48,
               prototype);
  }
  if (object == (JsValueRef *)0x0) {
    exitStatus = JsErrorNullArgument;
  }
  else {
    if (prototype == (JsValueRef)0x0) {
      pRVar4 = (RecyclableObject *)0x0;
    }
    else {
      BVar2 = Js::JavascriptOperators::IsObject(prototype);
      if (BVar2 == 0) {
        exitStatus = JsErrorArgumentNotObject;
        goto LAB_00362928;
      }
      pRVar4 = Js::VarTo<Js::RecyclableObject>(prototype);
      pSVar1 = (((((pRVar4->type).ptr)->javascriptLibrary).ptr)->super_JavascriptLibraryBase).
               scriptContext.ptr;
      if (pSVar1 != scriptContext) {
        exitStatus = JsErrorWrongRuntime;
        if (pSVar1->threadContext != scriptContext->threadContext) goto LAB_00362928;
        prototype = Js::CrossSite::MarshalVar(scriptContext,pRVar4,false);
      }
      pRVar4 = Js::VarTo<Js::RecyclableObject>(prototype);
    }
    pJVar5 = JsrtExternalObject::Create
                       (data,0,finalizeCallback,pRVar4,scriptContext,(JsrtExternalType *)0x0);
    *object = pJVar5;
    exitStatus = JsNoError;
    if (scriptContext->TTDShouldPerformRecordAction == true) {
      TTD::TTDJsRTActionResultAutoRecorder::SetResult
                ((TTDJsRTActionResultAutoRecorder *)auStack_48,object);
      exitStatus = JsNoError;
    }
  }
LAB_00362928:
  AutoNestedHandledExceptionType::~AutoNestedHandledExceptionType(local_68);
LAB_00362931:
  TTD::TTDJsRTActionResultAutoRecorder::CompleteWithStatusCode
            ((TTDJsRTActionResultAutoRecorder *)auStack_48,exitStatus);
  return exitStatus;
}

Assistant:

CHAKRA_API JsCreateExternalObjectWithPrototype(_In_opt_ void *data,
    _In_opt_ JsFinalizeCallback finalizeCallback,
    _In_opt_ JsValueRef prototype,
    _Out_ JsValueRef *object)
{
    return ContextAPINoScriptWrapper([&](Js::ScriptContext *scriptContext, TTDRecorder& _actionEntryPopper) -> JsErrorCode {
        PERFORM_JSRT_TTD_RECORD_ACTION(scriptContext, RecordJsRTAllocateExternalObject, prototype);

        PARAM_NOT_NULL(object);

        Js::RecyclableObject * prototypeObject = nullptr;
        if (prototype != JS_INVALID_REFERENCE)
        {
            VALIDATE_INCOMING_OBJECT(prototype, scriptContext);
            prototypeObject = Js::VarTo<Js::RecyclableObject>(prototype);
        }

        *object = JsrtExternalObject::Create(data, 0, finalizeCallback, prototypeObject, scriptContext, nullptr);

        PERFORM_JSRT_TTD_RECORD_ACTION_RESULT(scriptContext, object);

        return JsNoError;
    });
}